

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Bloaty::AddBuiltInSources<10ul>
          (Bloaty *this,DataSourceDefinition (*sources) [10],Options *options)

{
  pointer pCVar1;
  unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
  *this_00;
  long in_RDI;
  __single_object configured_source;
  DataSourceDefinition *source;
  size_t i;
  Options *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff88;
  DataSource in_stack_ffffffffffffff8c;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  key_type *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  ulong local_20;
  
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    std::make_unique<bloaty::ConfiguredDataSource,bloaty::DataSourceDefinition_const&>
              ((DataSourceDefinition *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
              );
    pCVar1 = std::
             unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
             ::operator->((unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
                           *)0x19c100);
    if (pCVar1->effective_source == kSymbols) {
      in_stack_ffffffffffffff8c = EffectiveSymbolSource(in_stack_ffffffffffffff68);
      pCVar1 = std::
               unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
               ::operator->((unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
                             *)0x19c123);
      pCVar1->effective_source = in_stack_ffffffffffffff8c;
    }
    this_00 = (unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
               *)(in_RDI + 0xe8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    in_stack_ffffffffffffff68 =
         (Options *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
                       *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::
    unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>::
    operator=(this_00,(unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
                       *)in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    std::allocator<char>::~allocator(&local_61);
    std::
    unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>::
    ~unique_ptr(this_00);
  }
  return;
}

Assistant:

void AddBuiltInSources(const DataSourceDefinition (&sources)[T],
                         const Options& options) {
    for (size_t i = 0; i < T; i++) {
      const DataSourceDefinition& source = sources[i];
      auto configured_source = absl::make_unique<ConfiguredDataSource>(source);

      if (configured_source->effective_source == DataSource::kSymbols) {
        configured_source->effective_source = EffectiveSymbolSource(options);
      }

      all_known_sources_[source.name] = std::move(configured_source);
    }
  }